

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseStorage.h
# Opt level: O0

void __thiscall
Eigen::DenseStorage<int,_-1,_-1,_1,_0>::resize
          (DenseStorage<int,__1,__1,_1,_0> *this,Index size,Index rows,Index param_3)

{
  int *piVar1;
  Index param_3_local;
  Index rows_local;
  Index size_local;
  DenseStorage<int,__1,__1,_1,_0> *this_local;
  
  if (size != this->m_rows) {
    internal::conditional_aligned_delete_auto<int,true>(this->m_data,this->m_rows);
    if (size < 1) {
      this->m_data = (int *)0x0;
    }
    else {
      piVar1 = internal::conditional_aligned_new_auto<int,true>(size);
      this->m_data = piVar1;
    }
  }
  this->m_rows = rows;
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void resize(Index size, Index rows, Index)
    {
      if(size != m_rows*_Cols)
      {
        internal::conditional_aligned_delete_auto<T,(_Options&DontAlign)==0>(m_data, _Cols*m_rows);
        if (size>0) // >0 and not simply !=0 to let the compiler knows that size cannot be negative
          m_data = internal::conditional_aligned_new_auto<T,(_Options&DontAlign)==0>(size);
        else
          m_data = 0;
        EIGEN_INTERNAL_DENSE_STORAGE_CTOR_PLUGIN({})
      }
      m_rows = rows;
    }